

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *cur,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              out)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  bool bVar1;
  uint uVar2;
  reference pcVar3;
  difference_type dVar4;
  traits<char> *ptVar5;
  const_reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  ulong uVar8;
  undefined8 in_RDX;
  traits<char> *in_RSI;
  long in_RDI;
  int sub;
  char_type ch;
  converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
  converter;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  traits<char> *in_stack_fffffffffffffe18;
  converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
  *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  char *local_198;
  char *local_190;
  int local_17c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  error_type in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined1 local_139;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_129;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  result_type local_119;
  _func_int **local_118;
  _func_int **local_110;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined8 local_100;
  result_type local_f1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  _func_int **local_e8;
  _func_int **local_e0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 local_d0;
  result_type local_c1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 local_b1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined1 local_a1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_91;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_81;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_71;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  result_type local_61;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_51;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char local_41;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_32;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  traits<char> *local_28;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  undefined8 local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_28 = in_RSI;
  local_18.container = in_RCX;
  local_10 = in_RDX;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&local_30);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffe20,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffe18);
  if (bVar1) {
    local_32 = 0x5c;
    local_40 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&local_18,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_40);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
    local_8 = local_18.container;
  }
  else {
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    local_41 = *pcVar3;
    _Var7._M_current = (char *)(ulong)((int)local_41 - 0x45);
    switch(_Var7._M_current) {
    case (char *)0x0:
      bVar1 = detail::set_transform<std::back_insert_iterator<std::__cxx11::string>>
                        (&local_18,op_none,scope_rest);
      if (!bVar1) {
        local_178 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_178);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      break;
    default:
      ptVar5 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                         ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                          (in_RDI + 0x80));
      uVar2 = (*ptVar5->_vptr_traits[5])(ptVar5,(ulong)(uint)(int)local_41,10);
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        local_1a8 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_1a8);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      else {
        ptVar5 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                           ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                            (in_RDI + 0x80));
        local_17c = (*ptVar5->_vptr_traits[5])
                              (ptVar5,(ulong)(uint)(int)local_41,10,
                               CONCAT71((int7)(uVar8 >> 8),local_41));
        pvVar6 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                              (size_type)in_stack_fffffffffffffe38.container);
        if ((pvVar6->matched & 1U) != 0) {
          pvVar6 = detail::
                   sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                                (size_type)in_stack_fffffffffffffe38.container);
          local_190 = (pvVar6->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).first._M_current;
          pvVar6 = detail::
                   sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                                (size_type)in_stack_fffffffffffffe38.container);
          local_198 = (pvVar6->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second._M_current;
          local_1a0 = local_18.container;
          __last._M_current._7_1_ = in_stack_fffffffffffffe47;
          __last._M_current._0_7_ = in_stack_fffffffffffffe40;
          local_18 = std::
                     copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
                               (_Var7,__last,in_stack_fffffffffffffe38);
        }
      }
      break;
    case (char *)0x7:
      bVar1 = detail::set_transform<std::back_insert_iterator<std::__cxx11::string>>
                        (&local_18,op_lower,scope_rest);
      if (!bVar1) {
        local_139 = 0x4c;
        local_148 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_148);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      break;
    case (char *)0x10:
      bVar1 = detail::set_transform<std::back_insert_iterator<std::__cxx11::string>>
                        (&local_18,op_upper,scope_rest);
      if (!bVar1) {
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xfffffffffffffe98);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      break;
    case (char *)0x1c:
      local_51 = 7;
      local_60 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_60);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x1e:
      __gnu_cxx::operator!=
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe20,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe18);
      detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                      (char *)in_stack_fffffffffffffea8.container,
                      (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                      (char *)in_stack_fffffffffffffe98.container,
                      CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      ptVar5 = intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                         ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                          (in_RDI + 0x80));
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_28);
      uVar2 = (*ptVar5->_vptr_traits[4])(ptVar5,0x61,0x7a,(ulong)(uint)(int)*pcVar3);
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffe18 =
             intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator->
                       ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)
                        (in_RDI + 0x80));
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_28);
        (*in_stack_fffffffffffffe18->_vptr_traits[4])
                  (in_stack_fffffffffffffe18,0x41,0x5a,(ulong)(uint)(int)*pcVar3);
      }
      detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                      (char *)in_stack_fffffffffffffea8.container,
                      (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                      (char *)in_stack_fffffffffffffe98.container,
                      CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_28);
      local_119 = numeric::
                  converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                  ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                                *)ptVar5,(argument_type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      local_128 = std::
                  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_128);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)ptVar5,(value_type *)in_stack_fffffffffffffe18);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_28);
      break;
    case (char *)0x20:
      local_61 = numeric::
                 converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                 ::operator()(in_stack_fffffffffffffe20,
                              (argument_type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      local_70 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_70);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x21:
      local_71 = 0xc;
      local_80 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_80);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x27:
      bVar1 = detail::set_transform<std::back_insert_iterator<std::__cxx11::string>>
                        (&local_18,op_lower,scope_next);
      if (!bVar1) {
        local_129 = 0x6c;
        local_138 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_138);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      break;
    case (char *)0x29:
      local_81 = 10;
      local_90 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_90);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x2d:
      local_91 = 0xd;
      local_a0 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_a0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x2f:
      local_a1 = 9;
      local_b0 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_b0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x30:
      bVar1 = detail::set_transform<std::back_insert_iterator<std::__cxx11::string>>
                        (&local_18,op_upper,scope_next);
      if (!bVar1) {
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xfffffffffffffea8);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      }
      break;
    case (char *)0x31:
      local_b1 = 0xb;
      local_c0 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_18,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_c0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
      break;
    case (char *)0x33:
      __gnu_cxx::operator!=
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe20,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe18);
      detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                      (char *)in_stack_fffffffffffffea8.container,
                      (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                      (char *)in_stack_fffffffffffffe98.container,
                      CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_28);
      if (*pcVar3 == '{') {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_28);
        __gnu_cxx::operator!=
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe20,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe18);
        detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                        (char *)in_stack_fffffffffffffea8.container,
                        (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                        (char *)in_stack_fffffffffffffe98.container,
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        local_30._M_current = (char *)local_28->_vptr_traits;
        local_d0 = local_10;
        ptVar5 = local_28;
        intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator*
                  ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)(in_RDI + 0x80));
        end_00._M_current._7_1_ = in_stack_fffffffffffffe47;
        end_00._M_current._0_7_ = in_stack_fffffffffffffe40;
        detail::
        toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ptVar5,end_00,(traits<char> *)in_stack_fffffffffffffe30._M_current,
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
        local_c1 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()(in_stack_fffffffffffffe20,
                                (argument_type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        local_d8 = std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_d8);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
        local_e0 = (_func_int **)local_30._M_current;
        local_e8 = local_28->_vptr_traits;
        _Var9._M_current._4_4_ = in_stack_fffffffffffffe2c;
        _Var9._M_current._0_4_ = in_stack_fffffffffffffe28;
        dVar4 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (in_stack_fffffffffffffe30,_Var9);
        if ((dVar4 == 4) &&
           (bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffe20,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffe18), bVar1)) {
          local_f0 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                  (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_f0);
        }
        detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                        (char *)in_stack_fffffffffffffea8.container,
                        (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                        (char *)in_stack_fffffffffffffe98.container,
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      }
      else {
        local_30._M_current = (char *)local_28->_vptr_traits;
        local_100 = local_10;
        _Var9._M_current = (char *)local_28;
        intrusive_ptr<const_boost::xpressive::detail::traits<char>_>::operator*
                  ((intrusive_ptr<const_boost::xpressive::detail::traits<char>_> *)(in_RDI + 0x80));
        end_01._M_current._7_1_ = in_stack_fffffffffffffe47;
        end_01._M_current._0_7_ = in_stack_fffffffffffffe40;
        detail::
        toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe38.container,end_01,(traits<char> *)_Var9._M_current,
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
        local_f1 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler_,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()(in_stack_fffffffffffffe20,
                                (argument_type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        local_108 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_18,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_108);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
        local_110 = (_func_int **)local_30._M_current;
        local_118 = local_28->_vptr_traits;
        _Var7._M_current._4_4_ = in_stack_fffffffffffffe2c;
        _Var7._M_current._0_4_ = in_stack_fffffffffffffe28;
        std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(_Var9,_Var7);
        detail::ensure_((bool)in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0,
                        (char *)in_stack_fffffffffffffea8.container,
                        (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                        (char *)in_stack_fffffffffffffe98.container,
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      }
    }
    local_8 = local_18.container;
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )local_8;
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }